

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastEndGroupImpl<unsigned_short>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char *pcVar1;
  uint *puVar2;
  
  if (data.field_0._0_2_ != 0) {
    pcVar1 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar1;
  }
  (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = (data.field_0._2_4_ & 0xffff) - 1;
  if ((ulong)table->has_bits_offset != 0) {
    puVar2 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar2 & 3) != 0) {
      AlignFail();
    }
    *puVar2 = *puVar2 | (uint)hasbits;
  }
  return ptr + 2;
}

Assistant:

const char* TcParser::FastEndGroupImpl(PROTOBUF_TC_PARAM_DECL) {
  if (PROTOBUF_PREDICT_FALSE(data.coded_tag<TagType>() != 0)) {
    PROTOBUF_MUSTTAIL return MiniParse(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  ctx->SetLastTag(data.decoded_tag());
  ptr += sizeof(TagType);
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}